

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

LexToken lex_scan(LexState *ls,TValue *tv)

{
  SBuf *sb;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  GCstr *pGVar6;
  byte *pbVar7;
  byte bVar8;
  ErrMsg em;
  LexToken tok;
  ulong uVar9;
  int iVar10;
  
  sb = &ls->sb;
  (ls->sb).w = (ls->sb).b;
  uVar9 = (ulong)ls->c;
  bVar8 = ""[uVar9 + 1];
  do {
    if ((char)bVar8 < '\0') {
      if ((bVar8 & 8) == 0) {
        do {
          pcVar5 = (ls->sb).w;
          if (*(int *)&(ls->sb).e == (int)pcVar5) {
            pcVar5 = lj_buf_more2(sb,1);
          }
          *pcVar5 = (char)uVar9;
          (ls->sb).w = pcVar5 + 1;
          pbVar7 = (byte *)ls->p;
          if (pbVar7 < ls->pe) {
            ls->p = (char *)(pbVar7 + 1);
            uVar9 = (ulong)*pbVar7;
          }
          else {
            uVar2 = lex_more(ls);
            uVar9 = (ulong)uVar2;
          }
          ls->c = (int)uVar9;
        } while ((char)""[(long)(int)uVar9 + 1] < '\0');
        pcVar5 = (ls->sb).b;
        pGVar6 = lj_parse_keepstr(ls,pcVar5,(ulong)(uint)(*(int *)&(ls->sb).w - (int)pcVar5));
        tv->u64 = (ulong)pGVar6 | 0xfffd800000000000;
        if (pGVar6->reserved == 0) {
          uVar2 = 0x11f;
        }
        else {
          uVar2 = pGVar6->reserved | 0x100;
        }
      }
      else {
LAB_00114e09:
        lex_number(ls,tv);
        uVar2 = 0x11e;
      }
      return uVar2;
    }
    uVar2 = (uint)uVar9;
    if ((int)uVar2 < 0xd) {
      if (((int)uVar2 < 0xb) && (uVar2 != 9)) {
        if (uVar2 != 10) {
          if (uVar2 == 0xffffffff) {
            return 0x121;
          }
          goto switchD_0011450e_caseD_3b;
        }
LAB_0011437d:
        lex_newline(ls);
      }
      else {
LAB_00114356:
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar2 = (uint)*pbVar7;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
      }
    }
    else {
      if ((int)uVar2 < 0x27) {
        if (uVar2 != 0xd) {
          if (uVar2 != 0x20) {
            if (uVar2 != 0x22) goto switchD_0011450e_caseD_3b;
            goto LAB_00114593;
          }
          goto LAB_00114356;
        }
        goto LAB_0011437d;
      }
      if (0x2d < (int)uVar2) {
        if ((int)uVar2 < 0x5b) {
          switch(uVar2) {
          case 0x3a:
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar2 = (uint)*pbVar7;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3a) {
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11d;
            }
            return 0x3a;
          case 0x3b:
            break;
          case 0x3c:
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar2 = (uint)*pbVar7;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11b;
            }
            return 0x3c;
          case 0x3d:
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar2 = (uint)*pbVar7;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x119;
            }
            return 0x3d;
          case 0x3e:
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar2 = (uint)*pbVar7;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11a;
            }
            return 0x3e;
          default:
            if (uVar2 == 0x2e) {
              pcVar5 = (ls->sb).w;
              if (*(int *)&(ls->sb).e == (int)pcVar5) {
                pcVar5 = lj_buf_more2(sb,1);
              }
              *pcVar5 = '.';
              (ls->sb).w = pcVar5 + 1;
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              if (uVar2 == 0x2e) {
                pbVar7 = (byte *)ls->p;
                if (pbVar7 < ls->pe) {
                  ls->p = (char *)(pbVar7 + 1);
                  uVar2 = (uint)*pbVar7;
                }
                else {
                  uVar2 = lex_more(ls);
                }
                ls->c = uVar2;
                if (uVar2 == 0x2e) {
                  pbVar7 = (byte *)ls->p;
                  if (pbVar7 < ls->pe) {
                    ls->p = (char *)(pbVar7 + 1);
                    uVar2 = (uint)*pbVar7;
                  }
                  else {
                    uVar2 = lex_more(ls);
                  }
                  ls->c = uVar2;
                  return 0x118;
                }
                return 0x117;
              }
              if ((""[(long)(int)uVar2 + 1] & 8) == 0) {
                return 0x2e;
              }
              goto LAB_00114e09;
            }
          }
        }
        else {
          if (uVar2 == 0x5b) {
            iVar10 = lex_skipeq(ls);
            if (-1 < iVar10) {
              lex_longstring(ls,tv,iVar10);
              return 0x120;
            }
            if (iVar10 == -1) {
              return 0x5b;
            }
            tok = 0x120;
            em = LJ_ERR_XLDELIM;
LAB_00114f5d:
            lj_lex_error(ls,tok,em);
          }
          if (uVar2 == 0x7e) {
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar2 = (uint)*pbVar7;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar2 = (uint)*pbVar7;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11c;
            }
            return 0x7e;
          }
        }
switchD_0011450e_caseD_3b:
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar4 = (uint)*pbVar7;
        }
        else {
          uVar4 = lex_more(ls);
        }
        ls->c = uVar4;
        return uVar2;
      }
      if (uVar2 != 0x2d) {
        if (uVar2 != 0x27) goto switchD_0011450e_caseD_3b;
LAB_00114593:
        pcVar5 = (ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pcVar5) {
          pcVar5 = lj_buf_more2(sb,1);
        }
        *pcVar5 = (char)uVar9;
        break;
      }
      pbVar7 = (byte *)ls->p;
      if (pbVar7 < ls->pe) {
        ls->p = (char *)(pbVar7 + 1);
        uVar2 = (uint)*pbVar7;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 != 0x2d) {
        return 0x2d;
      }
      pbVar7 = (byte *)ls->p;
      if (pbVar7 < ls->pe) {
        ls->p = (char *)(pbVar7 + 1);
        uVar2 = (uint)*pbVar7;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 == 0x5b) {
        iVar10 = lex_skipeq(ls);
        (ls->sb).w = (ls->sb).b;
        if (-1 < iVar10) {
          lex_longstring(ls,(TValue *)0x0,iVar10);
          (ls->sb).w = (ls->sb).b;
          goto LAB_00114449;
        }
        uVar2 = ls->c;
      }
      while ((0xe < uVar2 + 1 || ((0x4801U >> (uVar2 + 1 & 0x1f) & 1) == 0))) {
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar2 = (uint)*pbVar7;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
      }
    }
LAB_00114449:
    uVar9 = (ulong)ls->c;
    bVar8 = ""[uVar9 + 1];
  } while( true );
LAB_001145a3:
  (ls->sb).w = pcVar5 + 1;
  pbVar7 = (byte *)ls->p;
  if (pbVar7 < ls->pe) {
    ls->p = (char *)(pbVar7 + 1);
    uVar4 = (uint)*pbVar7;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
  while( true ) {
    if (uVar4 == uVar2) {
      pcVar5 = (ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pcVar5) {
        pcVar5 = lj_buf_more2(sb,1);
      }
      *pcVar5 = (char)uVar9;
      pcVar5 = pcVar5 + 1;
      (ls->sb).w = pcVar5;
      pbVar7 = (byte *)ls->p;
      if (pbVar7 < ls->pe) {
        ls->p = (char *)(pbVar7 + 1);
        uVar2 = (uint)*pbVar7;
      }
      else {
        uVar2 = lex_more(ls);
        pcVar5 = (ls->sb).w;
      }
      ls->c = uVar2;
      pcVar1 = (ls->sb).b;
      pGVar6 = lj_parse_keepstr(ls,pcVar1 + 1,(ulong)(((int)pcVar5 - (int)pcVar1) - 2));
      tv->u64 = (ulong)pGVar6 | 0xfffd800000000000;
      return 0x120;
    }
    if ((int)uVar4 < 0x5c) break;
    if (uVar4 != 0x5c) goto LAB_00114b3e;
    pbVar7 = (byte *)ls->p;
    if (pbVar7 < ls->pe) {
      ls->p = (char *)(pbVar7 + 1);
      uVar4 = (uint)*pbVar7;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    if ((int)uVar4 < 0x62) {
      if (0x21 < (int)uVar4) {
        if ((int)uVar4 < 0x5c) {
          if ((uVar4 != 0x22) && (uVar4 != 0x27)) goto switchD_0011465e_caseD_6f;
        }
        else if (uVar4 != 0x5c) {
          if (uVar4 != 0x61) goto switchD_0011465e_caseD_6f;
          uVar4 = 7;
        }
        goto LAB_00114a31;
      }
      if (uVar4 != 0xffffffff) {
        if ((uVar4 != 10) && (uVar4 != 0xd)) goto switchD_0011465e_caseD_6f;
        pcVar5 = (ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pcVar5) {
          pcVar5 = lj_buf_more2(sb,1);
        }
        *pcVar5 = '\n';
        (ls->sb).w = pcVar5 + 1;
        lex_newline(ls);
      }
    }
    else {
      switch(uVar4) {
      case 0x6e:
        uVar4 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
switchD_0011465e_caseD_6f:
        if ((""[(long)(int)uVar4 + 1] & 8) != 0) {
          pbVar7 = (byte *)ls->p;
          if (pbVar7 < ls->pe) {
            ls->p = (char *)(pbVar7 + 1);
            uVar3 = (uint)*pbVar7;
          }
          else {
            uVar3 = lex_more(ls);
          }
          iVar10 = uVar4 - 0x30;
          ls->c = uVar3;
          if ((""[(long)(int)uVar3 + 1] & 8) != 0) {
            pbVar7 = (byte *)ls->p;
            if (pbVar7 < ls->pe) {
              ls->p = (char *)(pbVar7 + 1);
              uVar4 = (uint)*pbVar7;
            }
            else {
              uVar4 = lex_more(ls);
            }
            iVar10 = (uVar3 - 0x30) + iVar10 * 10;
            ls->c = uVar4;
            if ((""[(long)(int)uVar4 + 1] & 8) != 0) {
              iVar10 = uVar4 + iVar10 * 10 + -0x30;
              if (0xff < iVar10) goto LAB_00114f37;
              pbVar7 = (byte *)ls->p;
              if (pbVar7 < ls->pe) {
                ls->p = (char *)(pbVar7 + 1);
                uVar4 = (uint)*pbVar7;
              }
              else {
                uVar4 = lex_more(ls);
              }
              ls->c = uVar4;
            }
          }
          pcVar5 = (ls->sb).w;
          if (*(int *)&(ls->sb).e == (int)pcVar5) {
            pcVar5 = lj_buf_more2(sb,1);
          }
          *pcVar5 = (char)iVar10;
          sb->w = pcVar5 + 1;
          goto LAB_00114a66;
        }
LAB_00114f37:
        tok = 0x120;
        em = LJ_ERR_XESC;
        goto LAB_00114f5d;
      case 0x72:
        uVar4 = 0xd;
        break;
      case 0x74:
        uVar4 = 9;
        break;
      case 0x75:
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar4 = (uint)*pbVar7;
        }
        else {
          uVar4 = lex_more(ls);
        }
        ls->c = uVar4;
        if (uVar4 != 0x7b) goto LAB_00114f37;
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar3 = (uint)*pbVar7;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
        uVar4 = 0;
        do {
          uVar4 = uVar3 & 0xf | uVar4 << 4;
          if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
            if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_00114f37;
            uVar4 = uVar4 + 9;
          }
          if (0x10ffff < (int)uVar4) goto LAB_00114f37;
          pbVar7 = (byte *)ls->p;
          if (pbVar7 < ls->pe) {
            ls->p = (char *)(pbVar7 + 1);
            uVar3 = (uint)*pbVar7;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
        } while (uVar3 != 0x7d);
        if ((int)uVar4 < 0x800) {
          if ((int)uVar4 < 0x80) break;
          pbVar7 = (byte *)(ls->sb).w;
          if (*(int *)&(ls->sb).e == (int)pbVar7) {
            pbVar7 = (byte *)lj_buf_more2(sb,1);
          }
          bVar8 = (byte)(uVar4 >> 6) | 0xc0;
        }
        else {
          if (uVar4 < 0x10000) {
            if ((uVar4 & 0xf800) == 0xd800) goto LAB_00114f37;
            pbVar7 = (byte *)(ls->sb).w;
            if (*(int *)&(ls->sb).e == (int)pbVar7) {
              pbVar7 = (byte *)lj_buf_more2(sb,1);
            }
            bVar8 = (byte)(uVar4 >> 0xc) | 0xe0;
          }
          else {
            pbVar7 = (byte *)(ls->sb).w;
            if (*(int *)&(ls->sb).e == (int)pbVar7) {
              pbVar7 = (byte *)lj_buf_more2(sb,1);
            }
            *pbVar7 = (byte)(uVar4 >> 0x12) | 0xf0;
            pbVar7 = pbVar7 + 1;
            (ls->sb).w = (char *)pbVar7;
            if (*(int *)&(ls->sb).e == (int)pbVar7) {
              pbVar7 = (byte *)lj_buf_more2(sb,1);
            }
            bVar8 = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
          }
          *pbVar7 = bVar8;
          pbVar7 = pbVar7 + 1;
          (ls->sb).w = (char *)pbVar7;
          if (*(int *)&(ls->sb).e == (int)pbVar7) {
            pbVar7 = (byte *)lj_buf_more2(sb,1);
          }
          bVar8 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        }
        *pbVar7 = bVar8;
        sb->w = (char *)(pbVar7 + 1);
        uVar4 = uVar4 & 0x3f | 0x80;
        break;
      case 0x76:
        uVar4 = 0xb;
        break;
      case 0x78:
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar4 = (uint)*pbVar7;
        }
        else {
          uVar4 = lex_more(ls);
        }
        ls->c = uVar4;
        iVar10 = (uVar4 & 0xf) * 0x10;
        if ((""[(long)(int)uVar4 + 1] & 8) == 0) {
          if ((""[(long)(int)uVar4 + 1] & 0x10) == 0) goto LAB_00114f37;
          iVar10 = iVar10 + 0x90;
        }
        pbVar7 = (byte *)ls->p;
        if (pbVar7 < ls->pe) {
          ls->p = (char *)(pbVar7 + 1);
          uVar3 = (uint)*pbVar7;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
        uVar4 = (uVar3 & 0xf) + iVar10;
        if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
          if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_00114f37;
          uVar4 = uVar4 + 9;
        }
        break;
      case 0x7a:
        do {
          pbVar7 = (byte *)ls->p;
          if (pbVar7 < ls->pe) {
            ls->p = (char *)(pbVar7 + 1);
            uVar4 = (uint)*pbVar7;
          }
          else {
            uVar4 = lex_more(ls);
          }
          ls->c = uVar4;
          while( true ) {
            if ((""[(long)(int)uVar4 + 1] & 2) == 0) goto LAB_00114a66;
            if ((uVar4 != 0xd) && (uVar4 != 10)) break;
            lex_newline(ls);
            uVar4 = ls->c;
          }
        } while( true );
      default:
        if (uVar4 == 0x62) {
          uVar4 = 8;
        }
        else {
          if (uVar4 != 0x66) goto switchD_0011465e_caseD_6f;
          uVar4 = 0xc;
        }
      }
LAB_00114a31:
      pcVar5 = (ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pcVar5) {
        pcVar5 = lj_buf_more2(sb,1);
      }
      *pcVar5 = (char)uVar4;
      (ls->sb).w = pcVar5 + 1;
      pbVar7 = (byte *)ls->p;
      if (pbVar7 < ls->pe) {
        ls->p = (char *)(pbVar7 + 1);
        uVar4 = (uint)*pbVar7;
      }
      else {
        uVar4 = lex_more(ls);
      }
      ls->c = uVar4;
    }
LAB_00114a66:
    uVar4 = ls->c;
  }
  if (uVar4 == 0xffffffff) {
    tok = 0x121;
    goto LAB_00114f58;
  }
  if ((uVar4 == 10) || (uVar4 == 0xd)) {
    tok = 0x120;
LAB_00114f58:
    em = LJ_ERR_XSTR;
    goto LAB_00114f5d;
  }
LAB_00114b3e:
  pcVar5 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar5) {
    pcVar5 = lj_buf_more2(sb,1);
  }
  *pcVar5 = (char)uVar4;
  goto LAB_001145a3;
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, ls->sb.b, sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}